

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineFramebufferAttachmentTests.cpp
# Opt level: O0

VkImageType vkt::pipeline::anon_unknown_0::getImageType(VkImageViewType viewType)

{
  VkImageType local_c;
  VkImageViewType viewType_local;
  
  if (viewType == VK_IMAGE_VIEW_TYPE_1D) {
LAB_0096bc28:
    local_c = VK_IMAGE_TYPE_1D;
  }
  else {
    if (viewType != VK_IMAGE_VIEW_TYPE_2D) {
      if (viewType == VK_IMAGE_VIEW_TYPE_3D) {
        return VK_IMAGE_TYPE_3D;
      }
      if (viewType != VK_IMAGE_VIEW_TYPE_CUBE) {
        if (viewType == VK_IMAGE_VIEW_TYPE_1D_ARRAY) goto LAB_0096bc28;
        if (1 < viewType - VK_IMAGE_VIEW_TYPE_2D_ARRAY) {
          return VK_IMAGE_TYPE_LAST;
        }
      }
    }
    local_c = VK_IMAGE_TYPE_2D;
  }
  return local_c;
}

Assistant:

VkImageType getImageType(const VkImageViewType viewType)
{
	switch (viewType)
	{
		case VK_IMAGE_VIEW_TYPE_1D:
		case VK_IMAGE_VIEW_TYPE_1D_ARRAY:
			return VK_IMAGE_TYPE_1D;

		case VK_IMAGE_VIEW_TYPE_2D:
		case VK_IMAGE_VIEW_TYPE_2D_ARRAY:
		case VK_IMAGE_VIEW_TYPE_CUBE:
		case VK_IMAGE_VIEW_TYPE_CUBE_ARRAY:
			return VK_IMAGE_TYPE_2D;

		case VK_IMAGE_VIEW_TYPE_3D:
			return VK_IMAGE_TYPE_3D;

		default:
			DE_ASSERT(0);
			return VK_IMAGE_TYPE_LAST;
	}
}